

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportFileGenerator::SetImportDetailProperties
          (cmExportFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  ManagedType MVar3;
  mapped_type *pmVar4;
  cmLinkInterface *pcVar5;
  char *pcVar6;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dummy;
  string prop;
  key_type local_208;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b0;
  key_type local_1a8 [11];
  
  this_00 = target->Makefile;
  local_1b0 = missingTargets;
  TVar2 = cmGeneratorTarget::GetType(target);
  if (((TVar2 == SHARED_LIBRARY) ||
      (TVar2 = cmGeneratorTarget::GetType(target), TVar2 == MODULE_LIBRARY)) &&
     (bVar1 = cmGeneratorTarget::IsDLLPlatform(target), !bVar1)) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    local_1a8[0]._M_string_length = 0;
    local_1a8[0].field_2._M_local_buf[0] = '\0';
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    bVar1 = cmGeneratorTarget::HasSOName(target,config);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator<char> *)&local_1c8
                );
      bVar1 = cmMakefile::IsOn(this_00,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      if (bVar1) {
        (*this->_vptr_cmExportFileGenerator[0x12])(&local_1e8,this,target,config);
        std::__cxx11::string::operator=((string *)&local_208,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      std::__cxx11::string::assign((char *)local_1a8);
      cmGeneratorTarget::GetSOName(&local_1e8,target,config);
      std::__cxx11::string::append((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    else {
      std::__cxx11::string::assign((char *)local_1a8);
      std::__cxx11::string::assign((char *)&local_208);
    }
    std::__cxx11::string::append((string *)local_1a8);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,local_1a8);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  pcVar5 = cmGeneratorTarget::GetLinkInterface(target,config,target);
  if (pcVar5 != (cmLinkInterface *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"IMPORTED_LINK_INTERFACE_LANGUAGES",(allocator<char> *)&local_208
              );
    SetImportLinkProperty<std::__cxx11::string>
              (this,suffix,target,local_1a8,&pcVar5->Languages,properties,local_1b0);
    std::__cxx11::string::~string((string *)local_1a8);
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"IMPORTED_LINK_DEPENDENT_LIBRARIES",(allocator<char> *)&local_208
              );
    SetImportLinkProperty<cmLinkItem>
              (this,suffix,target,local_1a8,&pcVar5->SharedDeps,properties,&local_1c8);
    std::__cxx11::string::~string((string *)local_1a8);
    if (pcVar5->Multiplicity != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"IMPORTED_LINK_INTERFACE_MULTIPLICITY",
                 (allocator<char> *)local_1a8);
      std::__cxx11::string::append((string *)&local_208);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__cxx11::stringbuf::str();
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,&local_208);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::__cxx11::string::~string((string *)&local_208);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
  }
  MVar3 = cmGeneratorTarget::GetManagedType(target,config);
  if (MVar3 != Native) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"IMPORTED_COMMON_LANGUAGE_RUNTIME",(allocator<char> *)&local_208)
    ;
    std::__cxx11::string::append((string *)local_1a8);
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
    local_208._M_string_length = 0;
    local_208.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"COMMON_LANGUAGE_RUNTIME",(allocator<char> *)&local_1c8);
    pcVar6 = cmGeneratorTarget::GetProperty(target,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    if ((pcVar6 != (char *)0x0) || (bVar1 = cmGeneratorTarget::IsCSharpOnly(target), bVar1)) {
      std::__cxx11::string::assign((char *)&local_208);
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,local_1a8);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)local_1a8);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportDetailProperties(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties,
  std::vector<std::string>& missingTargets)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  // Add the soname for unix shared libraries.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY ||
      target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    if (!target->IsDLLPlatform()) {
      std::string prop;
      std::string value;
      if (target->HasSOName(config)) {
        if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
          value = this->InstallNameDir(target, config);
        }
        prop = "IMPORTED_SONAME";
        value += target->GetSOName(config);
      } else {
        prop = "IMPORTED_NO_SONAME";
        value = "TRUE";
      }
      prop += suffix;
      properties[prop] = value;
    }
  }

  // Add the transitive link dependencies for this configuration.
  if (cmLinkInterface const* iface =
        target->GetLinkInterface(config, target)) {
    this->SetImportLinkProperty(suffix, target,
                                "IMPORTED_LINK_INTERFACE_LANGUAGES",
                                iface->Languages, properties, missingTargets);

    std::vector<std::string> dummy;
    this->SetImportLinkProperty(suffix, target,
                                "IMPORTED_LINK_DEPENDENT_LIBRARIES",
                                iface->SharedDeps, properties, dummy);
    if (iface->Multiplicity > 0) {
      std::string prop = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
      prop += suffix;
      std::ostringstream m;
      m << iface->Multiplicity;
      properties[prop] = m.str();
    }
  }

  // Add information if this target is a managed target
  if (target->GetManagedType(config) !=
      cmGeneratorTarget::ManagedType::Native) {
    std::string prop = "IMPORTED_COMMON_LANGUAGE_RUNTIME";
    prop += suffix;
    std::string propval;
    if (auto* p = target->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
      propval = p;
    } else if (target->IsCSharpOnly()) {
      // C# projects do not have the /clr flag, so we set the property
      // here to mark the target as (only) managed (i.e. no .lib file
      // to link to). Otherwise the  COMMON_LANGUAGE_RUNTIME target
      // property would have to be set manually for C# targets to make
      // exporting/importing work.
      propval = "CSharp";
    }
    properties[prop] = propval;
  }
}